

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CESkyCoord.cpp
# Opt level: O0

void CESkyCoord::Ecliptic2ICRS(CESkyCoord *in_ecliptic,CESkyCoord *out_icrs,CEDate *date)

{
  undefined8 uVar1;
  undefined8 uVar2;
  long *in_RDX;
  long *in_RSI;
  double *in_RDI;
  CEDate *this;
  double dVar3;
  CEAngle CVar4;
  double tt2;
  double tt1;
  double dec;
  double ra;
  double *in_stack_fffffffffffffea0;
  double *in_stack_fffffffffffffea8;
  double *in_stack_fffffffffffffeb0;
  CEDateType date_format;
  double in_stack_fffffffffffffeb8;
  CEDate *in_stack_fffffffffffffec0;
  double *angle;
  undefined4 local_114;
  undefined1 local_110 [16];
  undefined1 local_100 [16];
  undefined1 local_f0 [64];
  CEAngle local_b0 [2];
  undefined1 local_90 [64];
  CEAngle local_50;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 local_30;
  undefined8 local_28;
  undefined8 local_20 [2];
  long *local_10;
  double *local_8;
  
  local_20[0] = 0;
  local_28 = 0;
  local_30 = 0;
  local_38 = 0;
  local_10 = in_RSI;
  local_8 = in_RDI;
  local_40 = (**(code **)(*in_RDX + 0x28))();
  CEDate::UTC2TT(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
  uVar2 = local_30;
  uVar1 = local_38;
  date_format = (CEDateType)((ulong)in_stack_fffffffffffffeb0 >> 0x20);
  angle = local_8;
  CppEphem::julian_date_J2000();
  CEDate::CEDate(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,date_format);
  (**(code **)((long)*angle + 0x18))(&local_50,angle,local_90);
  this = (CEDate *)CEAngle::Rad(&local_50);
  dVar3 = CppEphem::julian_date_J2000();
  CEDate::CEDate(this,dVar3,(CEDateType)((ulong)local_8 >> 0x20));
  (**(code **)((long)*local_8 + 0x20))(local_b0,local_8,local_f0);
  dVar3 = CEAngle::Rad(local_b0);
  iauEceq06(uVar2,uVar1,this,dVar3,local_20,&local_28);
  CEAngle::~CEAngle((CEAngle *)0x1403f8);
  CEDate::~CEDate((CEDate *)0x140402);
  CEAngle::~CEAngle((CEAngle *)0x14040f);
  CEDate::~CEDate((CEDate *)0x14041c);
  CEAngle::Rad(angle);
  CVar4 = CEAngle::Rad(angle);
  local_114 = 1;
  (**(code **)(*local_10 + 0x28))(CVar4.angle_,local_10,local_100,local_110,&local_114);
  CEAngle::~CEAngle((CEAngle *)0x140480);
  CEAngle::~CEAngle((CEAngle *)0x14048a);
  return;
}

Assistant:

void CESkyCoord::Ecliptic2ICRS(const CESkyCoord& in_ecliptic,
                               CESkyCoord*       out_icrs,
                               const CEDate&     date)
{
    // Create the variables used for returning ICRS
    double ra(0.0);
    double dec(0.0);

    // Get current time in TT
    double tt1(0.0);
    double tt2(0.0);
    CEDate::UTC2TT(date.MJD(), &tt1, &tt2);

    // Convert ECLIPTIC to ICRS
    iauEceq06(tt1, tt2, 
              in_ecliptic.XCoord().Rad(), in_ecliptic.YCoord().Rad(), 
              &ra, &dec);

    // Set the output ICRS
    out_icrs->SetCoordinates(CEAngle::Rad(ra), CEAngle::Rad(dec),
                             CESkyCoordType::ICRS);
}